

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void upb_Array_Set(upb_Array *arr,size_t i,upb_MessageValue val)

{
  ulong uVar1;
  uint __line;
  sbyte sVar2;
  char *__assertion;
  upb_MessageValue val_local;
  
  val_local.str_val.size = val.str_val.size;
  val_local.int64_val = val._0_8_;
  uVar1 = arr->data_dont_copy_me__upb_internal_use_only;
  if ((uVar1 & 4) == 0) {
    if (i < arr->size_dont_copy_me__upb_internal_use_only) {
      sVar2 = ((uVar1 & 3) != 0) + ((byte)uVar1 & 3);
      memcpy((void *)((i << sVar2) + (uVar1 & 0xfffffffffffffff8)),&val_local,
             (ulong)(uint)(1 << sVar2));
      return;
    }
    __assertion = "i < upb_Array_Size(arr)";
    __line = 0x32;
  }
  else {
    __assertion = "!upb_Array_IsFrozen(arr)";
    __line = 0x31;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                ,__line,"void upb_Array_Set(upb_Array *, size_t, upb_MessageValue)");
}

Assistant:

void upb_Array_Set(upb_Array* arr, size_t i, upb_MessageValue val) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  UPB_ASSERT(i < upb_Array_Size(arr));
  char* data = upb_Array_MutableDataPtr(arr);
  const int lg2 = UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr);
  memcpy(data + (i << lg2), &val, 1 << lg2);
}